

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O1

size_t interp_decompress(uint32_t *obuff,size_t osize,uint8_t *ibuff,size_t isize)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  unsigned_long uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  long lVar13;
  long lVar14;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  vector<unsigned_long,_std::allocator<unsigned_long>_> T;
  allocator_type local_49;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,osize * 2 - 1,&local_49);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)ibuff;
  auVar21 = vpmovzxbq_avx512f(auVar2);
  auVar21 = vpsllvq_avx512f(auVar21,_DAT_001400c0);
  auVar20 = vextracti64x4_avx512f(auVar21,1);
  auVar21 = vpaddq_avx512f(auVar21,ZEXT3264(auVar20));
  auVar2 = vpaddq_avx(auVar21._0_16_,auVar21._16_16_);
  auVar12 = vpshufd_avx(auVar2,0xee);
  auVar2 = vpaddq_avx(auVar2,auVar12);
  *local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = auVar2._0_8_ + 1;
  if (osize == 1) {
    sVar15 = 8;
  }
  else {
    sVar15 = 8;
    lVar14 = 0;
    do {
      uVar3 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14];
      if (uVar3 - 1 == 0) {
        lVar16 = 1;
        lVar19 = 0;
      }
      else {
        uVar18 = 0;
        lVar16 = 0;
        lVar19 = 0;
        uVar17 = uVar3 - 1;
        do {
          lVar13 = lVar19 + sVar15;
          lVar19 = lVar19 + 1;
          lVar16 = lVar16 + ((ulong)ibuff[lVar13] << (uVar18 & 0x3f));
          uVar18 = uVar18 + 8;
          bVar4 = 0xff < uVar17;
          uVar17 = uVar17 >> 8;
        } while (bVar4);
        lVar16 = lVar16 + 1;
      }
      if ((lVar16 + uVar3 & 1) == 0) {
        uVar17 = (uVar3 - lVar16 >> 1) + 1;
      }
      else {
        uVar17 = lVar16 + uVar3 + 1 >> 1;
      }
      sVar15 = lVar19 + sVar15;
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar14 * 2 + 1] = uVar17;
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar14 * 2 + 2] = (uVar3 - uVar17) + 1;
      lVar14 = lVar14 + 1;
    } while (lVar14 != osize - 1);
  }
  if (osize != 0) {
    auVar21 = vpbroadcastq_avx512f();
    uVar17 = 0;
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar23 = vpbroadcastq_avx512f();
      auVar23 = vporq_avx512f(auVar23,auVar22);
      uVar18 = vpcmpuq_avx512f(auVar23,auVar21,2);
      auVar23 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (local_48.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start + osize + (uVar17 - 1)
                                   ));
      auVar24._8_8_ = (ulong)((byte)(uVar18 >> 1) & 1) * auVar23._8_8_;
      auVar24._0_8_ = (ulong)((byte)uVar18 & 1) * auVar23._0_8_;
      auVar24._16_8_ = (ulong)((byte)(uVar18 >> 2) & 1) * auVar23._16_8_;
      auVar24._24_8_ = (ulong)((byte)(uVar18 >> 3) & 1) * auVar23._24_8_;
      auVar24._32_8_ = (ulong)((byte)(uVar18 >> 4) & 1) * auVar23._32_8_;
      auVar24._40_8_ = (ulong)((byte)(uVar18 >> 5) & 1) * auVar23._40_8_;
      auVar24._48_8_ = (ulong)((byte)(uVar18 >> 6) & 1) * auVar23._48_8_;
      auVar24._56_8_ = (uVar18 >> 7) * auVar23._56_8_;
      puVar1 = obuff + uVar17;
      auVar20 = vpmovqd_avx512f(auVar24);
      bVar4 = (bool)((byte)uVar18 & 1);
      bVar5 = (bool)((byte)(uVar18 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar18 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar18 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar18 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar18 >> 6) & 1);
      bVar11 = SUB81(uVar18 >> 7,0);
      *puVar1 = (uint)bVar4 * auVar20._0_4_ | (uint)!bVar4 * *puVar1;
      puVar1[1] = (uint)bVar5 * auVar20._4_4_ | (uint)!bVar5 * puVar1[1];
      puVar1[2] = (uint)bVar6 * auVar20._8_4_ | (uint)!bVar6 * puVar1[2];
      puVar1[3] = (uint)bVar7 * auVar20._12_4_ | (uint)!bVar7 * puVar1[3];
      puVar1[4] = (uint)bVar8 * auVar20._16_4_ | (uint)!bVar8 * puVar1[4];
      puVar1[5] = (uint)bVar9 * auVar20._20_4_ | (uint)!bVar9 * puVar1[5];
      puVar1[6] = (uint)bVar10 * auVar20._24_4_ | (uint)!bVar10 * puVar1[6];
      puVar1[7] = (uint)bVar11 * auVar20._28_4_ | (uint)!bVar11 * puVar1[7];
      uVar17 = uVar17 + 8;
    } while ((osize + 7 & 0xfffffffffffffff8) != uVar17);
  }
  operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return sVar15;
}

Assistant:

size_t interp_decompress(uint32_t* obuff, /* output buffer */
    size_t osize, /* number symbols to be decoded */
    const uint8_t* ibuff, /* input buffer */
    size_t isize)
{ /* size of input buffer */
    int i, p;
    uint64_t vp, vl, vr, v;
    size_t ip = 0;

    std::vector<uint64_t> T(2 * osize - 1);
    ip += byte_decode(ibuff + ip, isize - ip, (1LL << 63), T.data());
    for (p = 0; p < osize - 1; p++) {
        vp = T[p];
        ip += byte_decode(ibuff + ip, isize - ip, vp, &v);
        if (((v + vp) & 1) == 0) {
            vl = 1 + ((vp - v) >> 1);
        } else {
            vl = (vp + v + 1) >> 1;
        }
        vr = vp - vl + 1;
        T[2 * p + 1] = vl;
        T[2 * p + 2] = vr;
    }
    for (i = 0; i < osize; i++) {
        obuff[i] = T[i + osize - 1];
    }
    return ip;
}